

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDColor.cpp
# Opt level: O3

void __thiscall EDColor::extractNewSegments(EDColor *this)

{
  Point_<int> *pPVar1;
  int iVar2;
  pointer pvVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  pointer pvVar9;
  pointer pPVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  int *piVar14;
  int iVar15;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> subVec;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  validSegments;
  int local_88;
  allocator_type local_81;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *local_80;
  void *local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  local_58;
  ulong local_38;
  
  local_58.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80 = &this->segments;
  pvVar3 = (this->segments).
           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar9 = (this->segments).
           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar9 == pvVar3) {
    local_88 = 0;
  }
  else {
    uVar12 = 0;
    local_88 = 0;
    do {
      pPVar10 = pvVar3[uVar12].
                super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar5 = (long)pvVar3[uVar12].
                    super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pPVar10;
      if (lVar5 != 0) {
        uVar6 = lVar5 >> 3;
        iVar15 = 0;
        local_38 = uVar12;
        do {
          uVar7 = (ulong)iVar15;
          uVar13 = uVar7;
          if (uVar7 < uVar6) {
            uVar13 = uVar6;
          }
          uVar7 = uVar7 - 1;
          do {
            uVar8 = uVar13;
            if (uVar7 - uVar13 == -1) break;
            lVar5 = uVar7 + 1;
            lVar11 = uVar7 + 1;
            uVar8 = uVar7 + 1;
            uVar7 = uVar8;
          } while (this->edgeImg
                   [(long)pPVar10[lVar5].y * (long)this->width + (long)pPVar10[lVar11].x] == '\0');
          iVar15 = (int)uVar8;
          lVar5 = (long)iVar15;
          uVar13 = lVar5 + 1;
          if (uVar6 <= uVar13) {
            uVar6 = uVar13;
          }
          uVar4 = (uint)uVar6;
          piVar14 = &pPVar10[lVar5 + 1].y;
          lVar11 = 0;
          do {
            if (uVar13 - uVar6 == lVar11) goto LAB_00115e14;
            iVar2 = *piVar14;
            pPVar1 = (Point_<int> *)(piVar14 + -1);
            lVar11 = lVar11 + -1;
            piVar14 = piVar14 + 2;
          } while (this->edgeImg[(long)iVar2 * (long)this->width + (long)pPVar1->x] != '\0');
          uVar4 = iVar15 - (int)lVar11;
          uVar6 = (ulong)uVar4;
LAB_00115e14:
          if (9 < (int)uVar6 - iVar15) {
            local_78 = (void *)0x0;
            uStack_70 = 0;
            local_68 = 0;
            std::
            vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
            ::emplace_back<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>
                      ((vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
                        *)&local_58,
                       (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&local_78);
            if (local_78 != (void *)0x0) {
              operator_delete(local_78);
            }
            lVar11 = *(long *)&(local_80->
                               super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start[uVar12].
                               super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                               ._M_impl.super__Vector_impl_data;
            std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::
            vector<cv::Point_<int>*,void>
                      ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)&local_78,
                       (Point_<int> *)(lVar11 + lVar5 * 8),
                       (Point_<int> *)(lVar11 + (long)(int)(uVar4 - 1) * 8),&local_81);
            std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator=
                      (local_58.
                       super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + local_88,
                       (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&local_78);
            if (local_78 != (void *)0x0) {
              operator_delete(local_78);
            }
            local_88 = local_88 + 1;
            pvVar3 = (local_80->
                     super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          }
          iVar15 = uVar4 + 1;
          pPVar10 = pvVar3[uVar12].
                    super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar6 = (long)pvVar3[uVar12].
                        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pPVar10 >> 3;
        } while ((ulong)(long)iVar15 < uVar6);
        pvVar9 = (this->segments).
                 super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        uVar12 = local_38;
      }
      uVar12 = uVar12 + 1;
      uVar6 = ((long)pvVar9 - (long)pvVar3 >> 3) * -0x5555555555555555;
    } while (uVar12 <= uVar6 && uVar6 - uVar12 != 0);
  }
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::operator=(local_80,&local_58);
  this->segmentNo = local_88;
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

void EDColor::extractNewSegments()
{
	vector< vector<Point> > validSegments;
	int noSegments = 0;

	for (int i = 0; i < segments.size(); i++) {
		int start = 0;
		while (start < segments[i].size()) {

			while (start < segments[i].size()) {
				int r = segments[i][start].y;
				int c = segments[i][start].x;

				if (edgeImg[r*width + c]) break;
				start++;
			} //end-while

			int end = start + 1;
			while (end < segments[i].size()) {
				int r = segments[i][end].y;
				int c = segments[i][end].x;

				if (edgeImg[r*width + c] == 0) break;
				end++;
			} //end-while

			int len = end - start;
			if (len >= 10) {
				// A new segment. Accepted only only long enough (whatever that means)
				//segments[noSegments].pixels = &map->segments[i].pixels[start];
				//segments[noSegments].noPixels = len;
				validSegments.push_back(vector<Point>());
				vector<Point> subVec(&segments[i][start], &segments[i][end - 1]);
				validSegments[noSegments] = subVec;
				noSegments++;
			} //end-else

			start = end + 1;
		} //end-while
	} //end-for

	// Update
	segments = validSegments;
	segmentNo = noSegments; // = validSegments.size()

}